

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

void __thiscall
DReachabilityPropagator::verificationDFS
          (DReachabilityPropagator *this,int r,vector<bool,_std::allocator<bool>_> *v)

{
  ulong *puVar1;
  uint uVar2;
  pointer pvVar3;
  uint *puVar4;
  BoolView *pBVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  uint *puVar10;
  
  uVar9 = (ulong)r;
  iVar6 = r + 0x3f;
  if (-1 < r) {
    iVar6 = r;
  }
  puVar1 = (v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p +
           (long)(iVar6 >> 6) +
           (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)r & 0x3f);
  pvVar3 = (this->ou).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = *(uint **)((long)&pvVar3[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + 8);
  pcVar7 = sat.assigns.data;
  for (puVar10 = *(uint **)&pvVar3[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data; puVar10 != puVar4; puVar10 = puVar10 + 1) {
    uVar2 = *puVar10;
    pBVar5 = (this->super_GraphPropagator).es.data;
    if ((pcVar7[(uint)pBVar5[uVar2].v] != '\0') &&
       ((uint)pBVar5[uVar2].s * 2 + -1 != (int)pcVar7[(uint)pBVar5[uVar2].v])) {
      iVar6 = *(int *)(*(long *)&(this->super_GraphPropagator).endnodes.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + 4);
      uVar9 = (ulong)iVar6;
      iVar8 = iVar6 + 0x3f;
      if (-1 < (long)uVar9) {
        iVar8 = iVar6;
      }
      if (((v->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start
           .super__Bit_iterator_base._M_p
           [(long)(iVar8 >> 6) +
            (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar9 & 0x3f) & 1) == 0) {
        verificationDFS(this,iVar6,v);
        pcVar7 = sat.assigns.data;
      }
    }
  }
  return;
}

Assistant:

void DReachabilityPropagator::verificationDFS(int r, std::vector<bool>& v) {
	v[r] = true;
	for (const int e : ou[r]) {
		if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isFalse()) {
			continue;
		}
		if (!v[getHead(e)]) {
			verificationDFS(getHead(e), v);
		}
	}
}